

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O2

bool __thiscall TCLAP::Arg::argMatches(Arg *this,string *argFlag)

{
  __type _Var1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  flagStartString_abi_cxx11_();
  std::operator+(&local_88,&local_68,&this->_flag);
  _Var1 = std::operator==(argFlag,&local_88);
  if (_Var1) {
    bVar2 = std::operator!=(&this->_flag,"");
    _Var1 = true;
    if (bVar2) goto LAB_001096eb;
  }
  nameStartString_abi_cxx11_();
  std::operator+(&local_48,&bStack_a8,&this->_name);
  _Var1 = std::operator==(argFlag,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&bStack_a8);
LAB_001096eb:
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  return _Var1;
}

Assistant:

inline bool Arg::argMatches( const std::string& argFlag ) const
{
	if ( ( argFlag == Arg::flagStartString() + _flag && _flag != "" ) ||
	       argFlag == Arg::nameStartString() + _name )
		return true;
	else
		return false;
}